

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O3

int MMDB_aget_value(MMDB_entry_s *start,MMDB_entry_data_s *entry_data,char **path)

{
  uint uVar1;
  uint32_t uVar2;
  MMDB_s *mmdb;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  int iVar13;
  int iVar14;
  int *piVar15;
  ulong uVar16;
  size_t __n;
  long lVar17;
  int iVar18;
  uint32_t uVar19;
  MMDB_entry_data_s key;
  char *first_invalid;
  char *local_b8;
  MMDB_entry_data_s local_98;
  MMDB_entry_data_s local_68;
  
  mmdb = start->mmdb;
  uVar19 = start->offset;
  entry_data->offset = 0;
  entry_data->offset_to_next = 0;
  entry_data->data_size = 0;
  entry_data->type = 0;
  (entry_data->field_1).utf8_string = (char *)0x0;
  *(undefined8 *)((long)&entry_data->field_1 + 8) = 0;
  *(undefined8 *)entry_data = 0;
  *(undefined8 *)&entry_data->field_0x8 = 0;
  iVar13 = decode_one_follow(mmdb,uVar19,entry_data);
  if ((iVar13 == 0) && (iVar13 = 8, entry_data->has_data == true)) {
    local_b8 = *path;
    iVar13 = 0;
    if (local_b8 != (char *)0x0) {
      lVar17 = 1;
      do {
        if (entry_data->type != 7) {
          if (entry_data->type == 0xb) {
            uVar1 = entry_data->data_size;
            piVar15 = __errno_location();
            iVar14 = *piVar15;
            *piVar15 = 0;
            uVar16 = strtol(local_b8,(char **)&local_68,10);
            iVar18 = *piVar15;
            *piVar15 = iVar14;
            if (iVar18 == 0x22) {
              iVar14 = 8;
              goto LAB_001045ab;
            }
            if ((-1 < (long)uVar16) || (uVar16 = uVar16 + uVar1, -1 < (long)uVar16)) {
              iVar14 = 9;
              if ((*(char *)CONCAT44(local_68._4_4_,local_68._0_4_) != '\0') || (uVar1 <= uVar16))
              goto LAB_001045ab;
              for (; uVar16 != 0; uVar16 = uVar16 - 1) {
                iVar14 = decode_one((MMDB_s *)mmdb->data_section,mmdb->data_section_size,
                                    (MMDB_entry_data_s *)(ulong)entry_data->offset_to_next);
                if ((iVar14 != 0) || (iVar14 = skip_map_or_array(mmdb,entry_data), iVar14 != 0))
                goto LAB_001045ab;
              }
              iVar14 = decode_one_follow(mmdb,entry_data->offset_to_next,&local_98);
              uVar3 = local_98._0_4_;
              uVar4 = local_98._4_4_;
              uVar5 = local_98._8_4_;
              uVar6 = local_98._12_4_;
              uVar7 = local_98.field_1.pointer;
              uVar8 = local_98.field_1.uint64._4_4_;
              uVar9 = local_98.field_1.uint128._8_4_;
              uVar10 = local_98.field_1.uint128._12_4_;
              uVar19 = local_98.offset;
              uVar2 = local_98.offset_to_next;
              uVar11 = local_98.data_size;
              uVar12 = local_98.type;
              goto joined_r0x0010449c;
            }
          }
LAB_0010459f:
          iVar14 = 9;
LAB_001045ab:
          entry_data->offset = 0;
          entry_data->offset_to_next = 0;
          entry_data->data_size = 0;
          entry_data->type = 0;
          (entry_data->field_1).utf8_string = (char *)0x0;
          *(undefined8 *)((long)&entry_data->field_1 + 8) = 0;
          *(undefined8 *)entry_data = 0;
          *(undefined8 *)&entry_data->field_0x8 = 0;
          return iVar14;
        }
        uVar19 = entry_data->offset_to_next;
        uVar2 = entry_data->data_size;
        __n = strlen(local_b8);
        iVar18 = uVar2 + 1;
        while( true ) {
          iVar18 = iVar18 + -1;
          if (iVar18 == 0) goto LAB_0010459f;
          iVar14 = decode_one_follow(mmdb,uVar19,&local_98);
          uVar19 = local_98.offset_to_next;
          if (iVar14 != 0) goto LAB_001045ab;
          if (local_98.type != 2) {
            iVar14 = 7;
            goto LAB_001045ab;
          }
          if ((__n == local_98.data_size) &&
             (iVar14 = bcmp(local_b8,(void *)CONCAT44(local_98.field_1.uint64._4_4_,
                                                      local_98.field_1.pointer),__n), iVar14 == 0))
          break;
          iVar14 = decode_one((MMDB_s *)mmdb->data_section,mmdb->data_section_size,
                              (MMDB_entry_data_s *)(ulong)uVar19);
          if ((iVar14 != 0) ||
             (iVar14 = skip_map_or_array(mmdb,&local_68), uVar19 = local_68.offset_to_next,
             iVar14 != 0)) goto LAB_001045ab;
        }
        iVar14 = decode_one_follow(mmdb,uVar19,&local_68);
        uVar3 = local_68._0_4_;
        uVar4 = local_68._4_4_;
        uVar5 = local_68._8_4_;
        uVar6 = local_68._12_4_;
        uVar7 = local_68.field_1.pointer;
        uVar8 = local_68.field_1.uint64._4_4_;
        uVar9 = local_68.field_1.uint128._8_4_;
        uVar10 = local_68.field_1.uint128._12_4_;
        uVar19 = local_68.offset;
        uVar2 = local_68.offset_to_next;
        uVar11 = local_68.data_size;
        uVar12 = local_68.type;
joined_r0x0010449c:
        if (iVar14 != 0) goto LAB_001045ab;
        entry_data->offset = uVar19;
        entry_data->offset_to_next = uVar2;
        entry_data->data_size = uVar11;
        entry_data->type = uVar12;
        (entry_data->field_1).pointer = uVar7;
        *(undefined4 *)((long)&entry_data->field_1 + 4) = uVar8;
        *(undefined4 *)((long)&entry_data->field_1 + 8) = uVar9;
        *(undefined4 *)((long)&entry_data->field_1 + 0xc) = uVar10;
        entry_data->has_data = SUB41(uVar3,0);
        *(int3 *)&entry_data->field_0x1 = SUB43(uVar3,1);
        *(undefined4 *)&entry_data->field_0x4 = uVar4;
        *(undefined4 *)&entry_data->field_0x8 = uVar5;
        *(undefined4 *)&entry_data->field_0xc = uVar6;
        local_b8 = path[lVar17];
        lVar17 = lVar17 + 1;
      } while (local_b8 != (char *)0x0);
    }
  }
  return iVar13;
}

Assistant:

int MMDB_aget_value(MMDB_entry_s *const start,
                    MMDB_entry_data_s *const entry_data,
                    const char *const *const path) {
    const MMDB_s *const mmdb = start->mmdb;
    uint32_t offset = start->offset;

    memset(entry_data, 0, sizeof(MMDB_entry_data_s));
    DEBUG_NL;
    DEBUG_MSG("looking up value by path");

    CHECKED_DECODE_ONE_FOLLOW(mmdb, offset, entry_data);

    DEBUG_NL;
    DEBUG_MSGF("top level element is a %s", type_num_to_name(entry_data->type));

    /* Can this happen? It'd probably represent a pathological case under
     * normal use, but there's nothing preventing someone from passing an
     * invalid MMDB_entry_s struct to this function */
    if (!entry_data->has_data) {
        return MMDB_INVALID_LOOKUP_PATH_ERROR;
    }

    const char *path_elem;
    int i = 0;
    while (NULL != (path_elem = path[i++])) {
        DEBUG_NL;
        DEBUG_MSGF("path elem = %s", path_elem);

        /* XXX - it'd be good to find a quicker way to skip through these
           entries that doesn't involve decoding them
           completely. Basically we need to just use the size from the
           control byte to advance our pointer rather than calling
           decode_one(). */
        if (entry_data->type == MMDB_DATA_TYPE_ARRAY) {
            int status = lookup_path_in_array(path_elem, mmdb, entry_data);
            if (MMDB_SUCCESS != status) {
                memset(entry_data, 0, sizeof(MMDB_entry_data_s));
                return status;
            }
        } else if (entry_data->type == MMDB_DATA_TYPE_MAP) {
            int status = lookup_path_in_map(path_elem, mmdb, entry_data);
            if (MMDB_SUCCESS != status) {
                memset(entry_data, 0, sizeof(MMDB_entry_data_s));
                return status;
            }
        } else {
            /* Once we make the code traverse maps & arrays without calling
             * decode_one() we can get rid of this. */
            memset(entry_data, 0, sizeof(MMDB_entry_data_s));
            return MMDB_LOOKUP_PATH_DOES_NOT_MATCH_DATA_ERROR;
        }
    }

    return MMDB_SUCCESS;
}